

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void __thiscall NetworkError::NetworkError(NetworkError *this,int type,string *id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_ENerror).code = 0;
  (this->super_ENerror).msg._M_dataplus._M_p = (pointer)&(this->super_ENerror).msg.field_2;
  (this->super_ENerror).msg._M_string_length = 0;
  (this->super_ENerror).msg.field_2._M_local_buf[0] = '\0';
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00156b00;
  if ((uint)type < 9) {
    (this->super_ENerror).code = NetworkErrorCodes[(uint)type];
    std::operator+(&local_40,
                   _ZL16NetworkErrorMsgs_rel +
                   *(int *)(_ZL16NetworkErrorMsgs_rel + (ulong)(uint)type * 4),id);
    std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

NetworkError::NetworkError(int type, string id)
{
    if (type >= 0 && type < NETWORK_ERROR_LIMIT)
    {
        code = NetworkErrorCodes[type];
        msg = NetworkErrorMsgs[type] + id;
    }
}